

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mbuf_resize(mbuf *a,size_t new_size)

{
  char *pcVar1;
  char *buf;
  size_t new_size_local;
  mbuf *a_local;
  
  if (((a->size < new_size) || ((new_size < a->size && (a->len <= new_size)))) &&
     ((pcVar1 = (char *)realloc(a->buf,new_size), pcVar1 != (char *)0x0 || (new_size == 0)))) {
    a->buf = pcVar1;
    a->size = new_size;
  }
  return;
}

Assistant:

void mbuf_resize(struct mbuf *a, size_t new_size) {
    if (new_size > a->size || (new_size < a->size && new_size >= a->len)) {
        char *buf = (char *) MBUF_REALLOC(a->buf, new_size);
        /*
     * In case realloc fails, there's not much we can do, except keep things as
     * they are. Note that NULL is a valid return value from realloc when
     * size == 0, but that is covered too.
     */
        if (buf == NULL && new_size != 0) return;
        a->buf = buf;
        a->size = new_size;
    }
}